

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpreadwrite.c
# Opt level: O1

int http_GetHttpResponse
              (void *Handle,UpnpString *headers,char **contentType,int *contentLength,
              int *httpStatus,int timeout)

{
  http_parser_t *parser;
  bool bVar1;
  int iVar2;
  parse_status_t pVar3;
  http_header_t *phVar4;
  int iVar5;
  int http_error_code;
  memptr ctype;
  int iStack_48;
  int local_44;
  memptr local_40;
  
  parser = (http_parser_t *)((long)Handle + 0x90);
  local_44 = timeout;
  iVar2 = ReadResponseLineAndHeaders((SOCKINFO *)Handle,parser,&local_44,&iStack_48);
  iVar5 = -0x71;
  if (iVar2 == 4) {
    pVar3 = parser_get_entity_read_method(parser);
    if ((pVar3 == PARSE_CONTINUE_1) || (pVar3 == PARSE_SUCCESS)) {
      if (httpStatus != (int *)0x0) {
        *httpStatus = *(int *)((long)Handle + 0x16c);
      }
      if (contentType != (char **)0x0) {
        phVar4 = httpmsg_find_hdr((http_message_t *)parser,4,&local_40);
        if (phVar4 != (http_header_t *)0x0) {
          phVar4 = (http_header_t *)local_40.buf;
        }
        *contentType = (char *)phVar4;
      }
      bVar1 = true;
      if (contentLength == (int *)0x0) {
LAB_0011016a:
        iVar5 = 0;
      }
      else {
        iVar5 = 0;
        iVar2 = 0;
        if (*(int *)((long)Handle + 0x248) != 4) {
          iVar2 = *(int *)((long)Handle + 0x24c);
          if (iVar2 == 4) {
            iVar2 = -4;
          }
          else if (iVar2 == 3) {
            iVar2 = -3;
          }
          else {
            if (iVar2 != 2) goto LAB_0011016a;
            iVar2 = *(int *)((long)Handle + 0x250);
          }
        }
        *contentLength = iVar2;
      }
      goto LAB_0011012e;
    }
  }
  bVar1 = false;
LAB_0011012e:
  if (!bVar1) {
    httpmsg_destroy((http_message_t *)parser);
  }
  return iVar5;
}

Assistant:

int http_GetHttpResponse(void *Handle,
	UpnpString *headers,
	char **contentType,
	int *contentLength,
	int *httpStatus,
	int timeout)
{
	int ret_code;
	int http_error_code;
	memptr ctype;
	http_connection_handle_t *handle = Handle;
	parse_status_t status;

	status = ReadResponseLineAndHeaders(&handle->sock_info,
		&handle->response,
		&timeout,
		&http_error_code);
	if (status != (parse_status_t)PARSE_OK) {
		ret_code = UPNP_E_BAD_RESPONSE;
		goto errorHandler;
	}
	status = parser_get_entity_read_method(&handle->response);
	switch (status) {
	case PARSE_CONTINUE_1:
	case PARSE_SUCCESS:
		break;
	default:
		ret_code = UPNP_E_BAD_RESPONSE;
		goto errorHandler;
	}
	ret_code = UPNP_E_SUCCESS;
	if (httpStatus) {
		*httpStatus = handle->response.msg.status_code;
	}
	if (contentType) {
		if (!httpmsg_find_hdr(
			    &handle->response.msg, HDR_CONTENT_TYPE, &ctype))
			/* no content-type */
			*contentType = NULL;
		else
			*contentType = ctype.buf;
	}
	if (contentLength) {
		if (handle->response.position == (parser_pos_t)POS_COMPLETE)
			*contentLength = 0;
		else if (handle->response.ent_position == ENTREAD_USING_CHUNKED)
			*contentLength = UPNP_USING_CHUNKED;
		else if (handle->response.ent_position == ENTREAD_USING_CLEN)
			*contentLength = (int)handle->response.content_length;
		else if (handle->response.ent_position == ENTREAD_UNTIL_CLOSE)
			*contentLength = UPNP_UNTIL_CLOSE;
	}

	if (headers) {
		copy_msg_headers(&handle->response.msg.headers, headers);
	}

errorHandler:
	if (ret_code != UPNP_E_SUCCESS)
		httpmsg_destroy(&handle->response.msg);
	return ret_code;
}